

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mo_lambda.cpp
# Opt level: O2

plural_ptr __thiscall
booster::locale::gnu_gettext::lambda::anon_unknown_0::parser::cond_expr(parser *this)

{
  tokenizer *this_00;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> _Var1;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> _Var6;
  undefined8 *in_RSI;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> local_50;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> local_48;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> local_40;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> local_38;
  
  l2((parser *)&local_50);
  if (local_50._M_head_impl != (plural *)0x0) {
    _Var6._M_head_impl = local_50._M_head_impl;
    local_38._M_head_impl = (plural *)this;
    while( true ) {
      this_00 = (tokenizer *)*in_RSI;
      iVar4 = this_00->next_tocken;
      bVar3 = is_in(iVar4,(int *)&(anonymous_namespace)::level1);
      _Var2._M_head_impl = local_38._M_head_impl;
      if (!bVar3) break;
      iVar4 = tokenizer::get(this_00,(int *)0x0);
      l2((parser *)&local_50);
      if (local_50._M_head_impl == (plural *)0x0) {
        this = (parser *)local_38._M_head_impl;
        if (_Var6._M_head_impl != (plural *)0x0) {
          (*(_Var6._M_head_impl)->_vptr_plural[3])(_Var6._M_head_impl);
          this = (parser *)local_38._M_head_impl;
        }
        goto LAB_00189253;
      }
      local_48._M_head_impl = local_50._M_head_impl;
      local_40._M_head_impl = _Var6._M_head_impl;
      bin_factory((anon_unknown_0 *)&local_50,iVar4,(plural_ptr *)&local_40,(plural_ptr *)&local_48)
      ;
      _Var6._M_head_impl = local_50._M_head_impl;
      if (local_48._M_head_impl != (plural *)0x0) {
        (*(local_48._M_head_impl)->_vptr_plural[3])();
      }
      local_48._M_head_impl = (plural *)0x0;
      if (local_40._M_head_impl != (plural *)0x0) {
        (*(local_40._M_head_impl)->_vptr_plural[3])();
      }
      local_40._M_head_impl = (plural *)0x0;
    }
    this = (parser *)local_38._M_head_impl;
    if (_Var6._M_head_impl != (plural *)0x0) {
      if (iVar4 != 0x3f) {
        *local_38._M_head_impl = (plural)_Var6._M_head_impl;
        return (__uniq_ptr_data<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>,_true,_true>
                )(__uniq_ptr_data<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>,_true,_true>
                  )local_38._M_head_impl;
      }
      tokenizer::get(this_00,(int *)0x0);
      cond_expr((parser *)&local_50);
      _Var1._M_head_impl = local_50._M_head_impl;
      if (local_50._M_head_impl == (plural *)0x0) {
        *_Var2._M_head_impl = (_func_int **)0x0;
      }
      else {
        iVar4 = tokenizer::get((tokenizer *)*in_RSI,(int *)0x0);
        if ((iVar4 == 0x3a) &&
           (cond_expr((parser *)&local_50), local_50._M_head_impl != (plural *)0x0)) {
          puVar5 = (undefined8 *)operator_new(0x20);
          *puVar5 = &PTR_operator___001da330;
          puVar5[1] = _Var6._M_head_impl;
          puVar5[2] = _Var1._M_head_impl;
          puVar5[3] = local_50._M_head_impl;
          *_Var2._M_head_impl = (plural)puVar5;
          return (__uniq_ptr_data<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>,_true,_true>
                  )(__uniq_ptr_data<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>,_true,_true>
                    )_Var2._M_head_impl;
        }
        *_Var2._M_head_impl = (_func_int **)0x0;
        (*(_Var1._M_head_impl)->_vptr_plural[3])(_Var1._M_head_impl);
      }
      (*(_Var6._M_head_impl)->_vptr_plural[3])(_Var6._M_head_impl);
      return (__uniq_ptr_data<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>,_true,_true>
              )(__uniq_ptr_data<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>,_true,_true>
                )_Var2._M_head_impl;
    }
  }
LAB_00189253:
  ((plural *)this)->_vptr_plural = (_func_int **)0x0;
  return (__uniq_ptr_data<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>,_true,_true>
          )(tuple<booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
            )this;
}

Assistant:

plural_ptr cond_expr()
        {
            plural_ptr cond,case1,case2;
            if((cond=l1()).get()==0)
                return plural_ptr();
            if(t.next()=='?') {
                t.get();
                if((case1=cond_expr()).get()==0)
                    return plural_ptr();
                if(t.get()!=':')
                    return plural_ptr();
                if((case2=cond_expr()).get()==0)
                    return plural_ptr();
            }
            else {
                return cond;
            }
            return plural_ptr(new conditional(std::move(cond),std::move(case1),std::move(case2)));
        }